

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void close_func(LexState *ls)

{
  FuncState *fs;
  lua_State *L;
  Proto *pPVar1;
  Vardesc *pVVar2;
  uint uVar3;
  Instruction *pIVar4;
  ls_byte *plVar5;
  AbsLineInfo *pAVar6;
  TValue *pTVar7;
  Proto **ppPVar8;
  LocVar *pLVar9;
  Upvaldesc *pUVar10;
  long lVar11;
  int first;
  
  fs = ls->fs;
  L = ls->L;
  pPVar1 = fs->f;
  uVar3 = (uint)fs->nactvar;
  do {
    if ((int)uVar3 < 1) {
      first = 0;
      goto LAB_0014928e;
    }
    uVar3 = uVar3 - 1;
    pVVar2 = (fs->ls->dyd->actvar).arr;
    lVar11 = (long)(int)(fs->firstlocal + uVar3);
  } while (*(char *)((long)pVVar2 + lVar11 * 0x18 + 9) == '\x03');
  first = (&pVVar2->vd)[lVar11].ridx + 1;
LAB_0014928e:
  luaK_ret(fs,first,0);
  leaveblock(fs);
  luaK_finish(fs);
  pIVar4 = (Instruction *)luaM_shrinkvector_(L,pPVar1->code,&pPVar1->sizecode,fs->pc,4);
  pPVar1->code = pIVar4;
  plVar5 = (ls_byte *)luaM_shrinkvector_(L,pPVar1->lineinfo,&pPVar1->sizelineinfo,fs->pc,1);
  pPVar1->lineinfo = plVar5;
  pAVar6 = (AbsLineInfo *)
           luaM_shrinkvector_(L,pPVar1->abslineinfo,&pPVar1->sizeabslineinfo,fs->nabslineinfo,8);
  pPVar1->abslineinfo = pAVar6;
  pTVar7 = (TValue *)luaM_shrinkvector_(L,pPVar1->k,&pPVar1->sizek,fs->nk,0x10);
  pPVar1->k = pTVar7;
  ppPVar8 = (Proto **)luaM_shrinkvector_(L,pPVar1->p,&pPVar1->sizep,fs->np,8);
  pPVar1->p = ppPVar8;
  pLVar9 = (LocVar *)
           luaM_shrinkvector_(L,pPVar1->locvars,&pPVar1->sizelocvars,(int)fs->ndebugvars,0x10);
  pPVar1->locvars = pLVar9;
  pUVar10 = (Upvaldesc *)
            luaM_shrinkvector_(L,pPVar1->upvalues,&pPVar1->sizeupvalues,(uint)fs->nups,0x10);
  pPVar1->upvalues = pUVar10;
  ls->fs = fs->prev;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
    return;
  }
  return;
}

Assistant:

static void close_func (LexState *ls) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  luaK_ret(fs, luaY_nvarstack(fs), 0);  /* final return */
  leaveblock(fs);
  lua_assert(fs->bl == NULL);
  luaK_finish(fs);
  luaM_shrinkvector(L, f->code, f->sizecode, fs->pc, Instruction);
  luaM_shrinkvector(L, f->lineinfo, f->sizelineinfo, fs->pc, ls_byte);
  luaM_shrinkvector(L, f->abslineinfo, f->sizeabslineinfo,
                       fs->nabslineinfo, AbsLineInfo);
  luaM_shrinkvector(L, f->k, f->sizek, fs->nk, TValue);
  luaM_shrinkvector(L, f->p, f->sizep, fs->np, Proto *);
  luaM_shrinkvector(L, f->locvars, f->sizelocvars, fs->ndebugvars, LocVar);
  luaM_shrinkvector(L, f->upvalues, f->sizeupvalues, fs->nups, Upvaldesc);
  ls->fs = fs->prev;
  luaC_checkGC(L);
}